

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O0

void __thiscall COLLADABU::URI::URI(URI *this,URI *copyFrom_,bool nofrag)

{
  String *pSVar1;
  long lVar2;
  byte in_DL;
  URI *in_RSI;
  URI *in_RDI;
  size_t pos;
  String *uriStr;
  URI *baseURI;
  String *in_stack_ffffffffffffffa8;
  URI *in_stack_ffffffffffffffb0;
  
  baseURI = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string((string *)&baseURI->mOriginalURIString);
  std::__cxx11::string::string((string *)&baseURI->mScheme);
  std::__cxx11::string::string((string *)&baseURI->mAuthority);
  std::__cxx11::string::string((string *)&baseURI->mPath);
  std::__cxx11::string::string((string *)&baseURI->mQuery);
  std::__cxx11::string::string((string *)&baseURI->mFragment);
  baseURI->mIsValid = false;
  initialize((URI *)0xc74745);
  if ((in_DL & 1) == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,(string *)in_RSI);
    std::__cxx11::string::operator=
              ((string *)&in_RDI->mOriginalURIString,(string *)&in_RSI->mOriginalURIString);
    std::__cxx11::string::operator=((string *)&in_RDI->mScheme,(string *)&in_RSI->mScheme);
    std::__cxx11::string::operator=((string *)&in_RDI->mAuthority,(string *)&in_RSI->mAuthority);
    std::__cxx11::string::operator=((string *)&in_RDI->mPath,(string *)&in_RSI->mPath);
    std::__cxx11::string::operator=((string *)&in_RDI->mQuery,(string *)&in_RSI->mQuery);
    std::__cxx11::string::operator=((string *)&in_RDI->mFragment,(string *)&in_RSI->mFragment);
    in_RDI->mIsValid = (bool)(in_RSI->mIsValid & 1);
  }
  else {
    pSVar1 = getURIString_abi_cxx11_(in_RSI);
    lVar2 = std::__cxx11::string::find_last_of((char)pSVar1,0x23);
    if (lVar2 == -1) {
      set(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,baseURI);
    }
    else {
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffffa8,(ulong)pSVar1);
      set(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,baseURI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
  }
  return;
}

Assistant:

URI::URI(const URI& copyFrom_, bool nofrag) 
		: mIsValid(false)
	{
		initialize();
		if (nofrag) {
			const String& uriStr = copyFrom_.getURIString();
			size_t pos = uriStr.find_last_of('#');
			if (pos != String::npos) {
				set(uriStr.substr(0, pos));
				return;
			}
			set(uriStr);
		}
		else
		{
			mUriString = copyFrom_.mUriString;
			mOriginalURIString = copyFrom_.mOriginalURIString;
			mScheme = copyFrom_.mScheme;
			mAuthority = copyFrom_.mAuthority;
			mPath = copyFrom_.mPath;
			mQuery = copyFrom_.mQuery;
			mFragment = copyFrom_.mFragment;
			mIsValid = copyFrom_.mIsValid;
		}
	}